

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonUnescapeOneChar(char *z,u32 n,u32 *piOut)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  u32 uVar5;
  int iVar6;
  int sz;
  u32 nSkip;
  u32 vlo;
  u32 v;
  u32 *piOut_local;
  u32 n_local;
  char *z_local;
  
  if (n < 2) {
    *piOut = 0x99999;
    return n;
  }
  cVar1 = z[1];
  if ((cVar1 == '\n') || (cVar1 == '\r')) {
LAB_001ea4ec:
    uVar4 = jsonBytesToBypass(z,n);
    z_local._4_4_ = n;
    if (uVar4 == 0) {
      *piOut = 0x99999;
    }
    else if (uVar4 == n) {
      *piOut = 0;
    }
    else if (z[uVar4] == '\\') {
      uVar5 = jsonUnescapeOneChar(z + uVar4,n - uVar4,piOut);
      z_local._4_4_ = uVar4 + uVar5;
    }
    else {
      iVar6 = sqlite3Utf8ReadLimited((u8 *)(z + uVar4),n - uVar4,piOut);
      z_local._4_4_ = uVar4 + iVar6;
    }
  }
  else {
    if ((cVar1 != '\"') && ((cVar1 != '\'' && (cVar1 != '/')))) {
      if (cVar1 == '0') {
        *piOut = 0;
        return 2;
      }
      if (cVar1 != '\\') {
        if (cVar1 == 'b') {
          *piOut = 8;
          return 2;
        }
        if (cVar1 == 'f') {
          *piOut = 0xc;
          return 2;
        }
        if (cVar1 == 'n') {
          *piOut = 10;
          return 2;
        }
        if (cVar1 == 'r') {
          *piOut = 0xd;
          return 2;
        }
        if (cVar1 == 't') {
          *piOut = 9;
          return 2;
        }
        if (cVar1 == 'u') {
          if (n < 6) {
            *piOut = 0x99999;
            return n;
          }
          uVar4 = jsonHexToInt4(z + 2);
          if (((((uVar4 & 0xfc00) == 0xd800) && (0xb < n)) && (z[6] == '\\')) &&
             ((z[7] == 'u' && (uVar5 = jsonHexToInt4(z + 8), (uVar5 & 0xfc00) == 0xdc00)))) {
            *piOut = (uVar4 & 0x3ff) * 0x400 + (uVar5 & 0x3ff) + 0x10000;
            return 0xc;
          }
          *piOut = uVar4;
          return 6;
        }
        if (cVar1 == 'v') {
          *piOut = 0xb;
          return 2;
        }
        if (cVar1 == 'x') {
          if (n < 4) {
            *piOut = 0x99999;
            return n;
          }
          bVar2 = jsonHexToInt((int)z[2]);
          bVar3 = jsonHexToInt((int)z[3]);
          *piOut = (uint)bVar2 << 4 | (uint)bVar3;
          return 4;
        }
        if (cVar1 != -0x1e) {
          *piOut = 0x99999;
          return 2;
        }
        goto LAB_001ea4ec;
      }
    }
    *piOut = (int)z[1];
    z_local._4_4_ = 2;
  }
  return z_local._4_4_;
}

Assistant:

static u32 jsonUnescapeOneChar(const char *z, u32 n, u32 *piOut){
  assert( n>0 );
  assert( z[0]=='\\' );
  if( n<2 ){
    *piOut = JSON_INVALID_CHAR;
    return n;
  }
  switch( (u8)z[1] ){
    case 'u': {
      u32 v, vlo;
      if( n<6 ){
        *piOut = JSON_INVALID_CHAR;
        return n;
      }
      v = jsonHexToInt4(&z[2]);
      if( (v & 0xfc00)==0xd800
       && n>=12
       && z[6]=='\\'
       && z[7]=='u'
       && ((vlo = jsonHexToInt4(&z[8]))&0xfc00)==0xdc00
      ){
        *piOut = ((v&0x3ff)<<10) + (vlo&0x3ff) + 0x10000;
        return 12;
      }else{
        *piOut = v;
        return 6;
      }
    }
    case 'b': {   *piOut = '\b';  return 2; }
    case 'f': {   *piOut = '\f';  return 2; }
    case 'n': {   *piOut = '\n';  return 2; }
    case 'r': {   *piOut = '\r';  return 2; }
    case 't': {   *piOut = '\t';  return 2; }
    case 'v': {   *piOut = '\v';  return 2; }
    case '0': {   *piOut = 0;     return 2; }
    case '\'':
    case '"':
    case '/':
    case '\\':{   *piOut = z[1];  return 2; }
    case 'x': {
      if( n<4 ){
        *piOut = JSON_INVALID_CHAR;
        return n;
      }
      *piOut = (jsonHexToInt(z[2])<<4) | jsonHexToInt(z[3]);
      return 4;
    }
    case 0xe2:
    case '\r':
    case '\n': {
      u32 nSkip = jsonBytesToBypass(z, n);
      if( nSkip==0 ){
        *piOut = JSON_INVALID_CHAR;
        return n;
      }else if( nSkip==n ){
        *piOut = 0;
        return n;
      }else if( z[nSkip]=='\\' ){
        return nSkip + jsonUnescapeOneChar(&z[nSkip], n-nSkip, piOut);
      }else{
        int sz = sqlite3Utf8ReadLimited((u8*)&z[nSkip], n-nSkip, piOut);
        return nSkip + sz;
      }
    }
    default: {
      *piOut = JSON_INVALID_CHAR;
      return 2;
    }
  }
}